

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p,int fMarked,int fSeq)

{
  Wlc_Obj_t *pObj;
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Wlc_Ntk_t *pNew;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar6;
  ulong uVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  Wlc_Obj_t *pWVar13;
  uint uVar14;
  long lVar15;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  uVar14 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar14) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar14 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((p->vCopies).pArray,0,(ulong)uVar14 * 4);
  }
  (p->vCopies).nSize = uVar14;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = p->fAsyncRst;
  pNew->fMemPorts = p->fMemPorts;
  pNew->fEasyFfs = p->fEasyFfs;
  if (0 < (p->vCis).nSize) {
    lVar15 = 0;
    do {
      iVar3 = (p->vCis).pArray[lVar15];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036e641;
      pWVar13 = p->pObjs + iVar3;
      if ((fMarked == 0) ||
         ((undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        uVar1 = *(ushort *)pWVar13;
        if (fSeq == 0) {
          *(ushort *)pWVar13 = (uVar1 & 0xffc0) + 1;
        }
        Wlc_ObjDup(pNew,p,(int)((ulong)((long)pWVar13 - (long)p->pObjs) >> 3) * -0x55555555,pVVar4);
        *(ushort *)pWVar13 = uVar1 & 0x3f | (ushort)*(undefined4 *)pWVar13 & 0xffc0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCis).nSize);
  }
  if (0 < (p->vFfs2).nSize) {
    lVar15 = 0;
    do {
      if ((p->vFfs2).nSize <= lVar15) goto LAB_0036e660;
      iVar3 = (p->vFfs2).pArray[lVar15];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036e641;
      pWVar13 = p->pObjs + iVar3;
      iVar3 = Wlc_ObjAlloc(pNew,*(ushort *)pWVar13 & 0x3f,*(ushort *)pWVar13 >> 6 & 1,pWVar13->End,
                           pWVar13->Beg);
      uVar14 = (int)((long)pWVar13 - (long)p->pObjs >> 3) * -0x55555555;
      if (((int)uVar14 < 0) || ((p->vCopies).nSize <= (int)uVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar14 & 0x7fffffff] = iVar3;
      Vec_IntPush(&pNew->vFfs2,iVar3);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vFfs2).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar15 = 0;
    do {
      iVar3 = (p->vCos).pArray[lVar15];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036e641;
      if ((fMarked == 0) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[iVar3] & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        Wlc_NtkDupDfs_rec(pNew,p,iVar3,pVVar4);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCos).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar15 = 0;
    do {
      iVar3 = (p->vCos).pArray[lVar15];
      lVar11 = (long)iVar3;
      if ((lVar11 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036e641;
      if ((fMarked == 0) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[lVar11] & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        if ((p->vCopies).nSize <= iVar3) goto LAB_0036e660;
        iVar3 = (p->vCopies).pArray[lVar11];
        if (((long)iVar3 < 1) || (pNew->nObjsAlloc <= iVar3)) goto LAB_0036e641;
        if (fSeq == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(uint *)(p->pObjs + lVar11) >> 10 & 1;
        }
        Wlc_ObjSetCo(pNew,pNew->pObjs + iVar3,uVar14);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCos).nSize);
  }
  if (0 < (p->vFfs2).nSize) {
    lVar15 = 0;
    do {
      if ((p->vFfs2).nSize <= lVar15) {
LAB_0036e660:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vFfs2).pArray[lVar15];
      lVar11 = (long)iVar3;
      if ((lVar11 < 1) || (p->nObjsAlloc <= iVar3)) {
LAB_0036e641:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar13 = p->pObjs + lVar11;
      uVar7 = (ulong)pWVar13->nFanins;
      if (0 < (int)pWVar13->nFanins) {
        lVar12 = 0;
        do {
          if ((2 < (uint)uVar7) ||
             (paVar6 = &pWVar13->field_10,
             (undefined1  [24])((undefined1  [24])*pWVar13 & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar13->field_10).pFanins[0];
          }
          Wlc_NtkDupDfs_rec(pNew,p,paVar6->Fanins[lVar12],pVVar4);
          lVar12 = lVar12 + 1;
          uVar7 = (ulong)(int)pWVar13->nFanins;
        } while (lVar12 < (long)uVar7);
      }
      Wlc_ObjCollectCopyFanins(p,iVar3,pVVar4);
      if ((p->vCopies).nSize <= iVar3) goto LAB_0036e660;
      iVar3 = (p->vCopies).pArray[lVar11];
      if (((long)iVar3 < 1) || (pNew->nObjsAlloc <= iVar3)) goto LAB_0036e641;
      pObj = pNew->pObjs + iVar3;
      Wlc_ObjAddFanins(pNew,pObj,pVVar4);
      *(ushort *)pObj = (ushort)*(undefined4 *)pObj & 0xf7ff | *(ushort *)pWVar13 & 0x800;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vFfs2).nSize);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  if ((fSeq != 0) && (pVVar4 = p->vInits, pVVar4 != (Vec_Int_t *)0x0)) {
    if (fMarked == 0) {
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      iVar3 = pVVar4->nSize;
      lVar15 = (long)iVar3;
      pVVar9->nSize = iVar3;
      pVVar9->nCap = iVar3;
      if (lVar15 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc(lVar15 * 4);
      }
      pVVar9->pArray = piVar5;
      memcpy(piVar5,pVVar4->pArray,lVar15 << 2);
      pNew->vInits = pVVar9;
      pcVar2 = p->pInits;
      if (pcVar2 == (char *)0x0) goto LAB_0036e5b1;
      sVar10 = strlen(pcVar2);
      pcVar8 = (char *)malloc(sVar10 + 1);
      strcpy(pcVar8,pcVar2);
    }
    else {
      pVVar4 = Wlc_ReduceMarkedInitVec(p,pVVar4);
      pNew->vInits = pVVar4;
      if (p->pInits == (char *)0x0) goto LAB_0036e5b1;
      pcVar8 = Wlc_ReduceMarkedInitStr(p,p->pInits);
    }
    pNew->pInits = pcVar8;
  }
LAB_0036e5b1:
  pcVar2 = p->pSpec;
  if (pcVar2 != (char *)0x0) {
    sVar10 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar8,pcVar2);
    pNew->pSpec = pcVar8;
  }
  if (0 < (p->vNameIds).nSize) {
    Wlc_NtkTransferNames(pNew,p);
  }
  iVar3 = (p->vPoPairs).nSize;
  if ((iVar3 != 0) && (0 < iVar3)) {
    lVar15 = 0;
    do {
      Vec_IntPush(&pNew->vPoPairs,(p->vPoPairs).pArray[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vPoPairs).nSize);
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p, int fMarked, int fSeq )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObjNew;
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !fMarked || pObj->Mark )
        {
            unsigned Type = pObj->Type;
            if ( !fSeq ) pObj->Type = WLC_OBJ_PI;
            Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
            pObj->Type = Type;
        }
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        int iObjNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        Vec_IntPush( &pNew->vFfs2, iObjNew );
    }
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), fSeq ? pObj->fIsFi : 0 );
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
        Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
        pObjNew = Wlc_NtkObj( pNew, Wlc_ObjCopy(p, iObj) );
        Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
        pObjNew->fXConst = pObj->fXConst;
    }
    Vec_IntFree( vFanins );
    if ( fSeq && p->vInits )
    {
        if ( fMarked )
        {
            if ( p->vInits )
                pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
            if ( p->pInits )
                pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
        }
        else
        {
            if ( p->vInits )
                pNew->vInits = Vec_IntDup( p->vInits );
            if ( p->pInits )
                pNew->pInits = Abc_UtilStrsav( p->pInits );
        }
    }
    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Wlc_NtkHasNameId(p) )
        Wlc_NtkTransferNames( pNew, p );
    if ( Vec_IntSize(&p->vPoPairs) )
        Vec_IntAppend( &pNew->vPoPairs, &p->vPoPairs );
    return pNew;
}